

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestCoherency::checkProgramWriteCoherency
          (TextureViewTestCoherency *this,_texture_type texture_type,bool should_use_images,
          _barrier_type barrier_type,_verification_mean verification_mean)

{
  ostringstream *this_00;
  uint uVar1;
  byte bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *pvVar6;
  long lVar7;
  TestError *this_01;
  undefined7 in_register_00000011;
  bool bVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  uint x;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  uint read_lod;
  uint write_to_height;
  uint write_to_width;
  GLuint write_to_id;
  int local_1bc;
  _verification_mean local_1b8;
  GLuint read_to_id;
  undefined1 local_1b0 [384];
  long lVar5;
  
  local_1b8 = verification_mean;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  write_to_id = 0;
  write_to_width = 0;
  write_to_height = 0;
  getWritePropertiesForTextureType(this,texture_type,&write_to_id,&write_to_width,&write_to_height);
  local_1bc = (int)CONCAT71(in_register_00000011,should_use_images);
  if (local_1bc == 0) {
    (**(code **)(lVar5 + 0x78))(0x8d40,this->m_draw_fbo_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBindFramebuffer() call failed for GL_FRAMEBUFFER target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x203d);
    (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,0xde1,write_to_id,1);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glFramebufferTexture2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2040);
    uVar17 = write_to_width;
    uVar9 = write_to_height;
    (**(code **)(lVar5 + 0x1a00))(0,0,write_to_width,write_to_height);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glViewport() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2046);
    (**(code **)(lVar5 + 0x1680))(this->m_gradient_write_po_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"gluseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x207d);
    (**(code **)(lVar5 + 0x538))(5,0,4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    pcVar10 = "glDrawArrays() call failed.";
    iVar3 = 0x2080;
  }
  else {
    (**(code **)(lVar5 + 0x80))(0,write_to_id,1,0,0,0x88b9,0x8058);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBindImageTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2036);
    (**(code **)(lVar5 + 0x1680))(this->m_gradient_image_write_po_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x204e);
    uVar17 = write_to_width;
    uVar9 = write_to_height;
    (**(code **)(lVar5 + 0x1530))
              (this->m_gradient_image_write_image_size_location,write_to_width,write_to_height);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glUniform2i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2051);
    (**(code **)(lVar5 + 0x5e0))(0x8c89);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2054);
    (**(code **)(lVar5 + 0x538))(0,0,uVar9 * uVar17);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2057);
    (**(code **)(lVar5 + 0x4e8))(0x8c89);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glDisable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x205a);
    if (barrier_type == BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT) {
      (**(code **)(lVar5 + 0xdb8))(0x100);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      pcVar10 = "glMemoryBarrier() call failed for GL_TEXTURE_UPDATE_BARRIER_BIT barrier";
      iVar3 = 0x206e;
    }
    else {
      if (barrier_type != BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unrecognized barrier type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x2075);
        goto LAB_00ab008a;
      }
      (**(code **)(lVar5 + 0xdb8))(8);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      pcVar10 = "glMemoryBarrier() call failed for GL_TEXTURE_FETCH_BARRIER_BIT barrier";
      iVar3 = 0x2064;
    }
  }
  glu::checkError(dVar4,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,iVar3);
  read_lod = 0;
  read_to_id = 0;
  getReadPropertiesForTextureType(this,texture_type,&read_to_id,&read_lod);
  (**(code **)(lVar5 + 8))(0x84c0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x208f);
  (**(code **)(lVar5 + 0xb8))(0xde1,read_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2092);
  uVar16 = uVar9 * uVar17;
  if (local_1b8 == VERIFICATION_MEAN_PROGRAM) {
    (**(code **)(lVar5 + 0x1680))(this->m_gradient_verification_po_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x209b);
    (**(code **)(lVar5 + 0x14f0))(this->m_gradient_verification_po_texture_location,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glUniform1i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x209e);
    (**(code **)(lVar5 + 0x14f0))
              (this->m_gradient_verification_po_sample_exact_uv_location,(undefined1)local_1bc);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glUniform1i() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a1);
    (**(code **)(lVar5 + 0x14e0))((float)read_lod,this->m_gradient_verification_po_lod_location);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glUniform1f() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a4);
    (**(code **)(lVar5 + 0x5e0))(0x8c89);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20a7);
    (**(code **)(lVar5 + 0x30))(0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20aa);
    (**(code **)(lVar5 + 0x538))(0,0,uVar16);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20ad);
    (**(code **)(lVar5 + 0x638))();
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b0);
    (**(code **)(lVar5 + 0x4e8))(0x8c89);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glDisable(GL_RASTERIZER_DISCARD) call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b3);
    lVar7 = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x20b8);
    if (lVar7 == 0) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"glMapBuffer() did not generate an error but returned a NULL pointer",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x20bc);
    }
    else {
      uVar11 = 0;
      while( true ) {
        if (uVar16 == uVar11) {
          (**(code **)(lVar5 + 0x1670))(0x8c8e);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x20d5);
          return;
        }
        if (*(int *)(lVar7 + uVar11 * 4) != 1) break;
        uVar11 = uVar11 + 1;
      }
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Invalid data was sampled at ");
      std::operator<<((ostream *)this_00,"(");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,") when sampling from ");
      pcVar10 = "a view";
      if (texture_type == TEXTURE_TYPE_PARENT_TEXTURE) {
        pcVar10 = "a texture";
      }
      std::operator<<((ostream *)this_00,pcVar10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      (**(code **)(lVar5 + 0x1670))(0x8c8e);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid data sampled",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x20cf);
    }
  }
  else {
    pvVar6 = operator_new__((ulong)(uVar16 * this->m_texture_n_components));
    (**(code **)(lVar5 + 0xaa0))(0xde1,read_lod,0x1908,0x1401);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 == 0) {
      bVar8 = true;
      for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
        uVar16 = uVar17 * this->m_texture_n_components * (int)uVar11;
        uVar12 = 0;
        uVar13 = 0;
        do {
          if (uVar17 == uVar13) goto LAB_00aafcca;
          fVar18 = (float)(uVar13 & 0xffffffff) / (float)uVar17;
          fVar19 = 1.0 - fVar18;
          iVar3 = (uint)*(byte *)((long)pvVar6 + uVar12 + uVar16) -
                  ((int)((fVar18 * 0.0 + fVar19) * 255.0) & 0xffU);
          bVar2 = (byte)iVar3;
          bVar14 = -bVar2;
          if (0 < iVar3) {
            bVar14 = bVar2;
          }
          if (1 < bVar14) break;
          iVar3 = (uint)*(byte *)((long)pvVar6 + uVar12 + (ulong)uVar16 + 1) -
                  ((int)((fVar19 * 0.9 + fVar18 * 0.1) * 255.0) & 0xffU);
          bVar2 = (byte)iVar3;
          bVar14 = -bVar2;
          if (0 < iVar3) {
            bVar14 = bVar2;
          }
          if (1 < bVar14) break;
          uVar15 = (int)((fVar19 * 0.0 + fVar18) * 255.0) & 0xff;
          iVar3 = *(byte *)((long)pvVar6 + uVar12 + (ulong)uVar16 + 2) - uVar15;
          bVar2 = (byte)iVar3;
          bVar14 = -bVar2;
          if (0 < iVar3) {
            bVar14 = bVar2;
          }
          if (1 < bVar14) break;
          uVar15 = *(byte *)((long)pvVar6 + uVar12 + (ulong)uVar16 + 3) - uVar15;
          uVar1 = -uVar15;
          if (0 < (int)uVar15) {
            uVar1 = uVar15;
          }
          uVar13 = uVar13 + 1;
          uVar12 = (ulong)((int)uVar12 + this->m_texture_n_components);
        } while (uVar1 < 2);
        bVar8 = false;
LAB_00aafcca:
      }
      operator_delete__(pvVar6);
      if (bVar8) {
        return;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid data sampled",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x2115);
    }
    else {
      operator_delete__(pvVar6);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"glGetTexImage() call failed.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x20e6);
    }
  }
LAB_00ab008a:
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestCoherency::checkProgramWriteCoherency(_texture_type texture_type, bool should_use_images,
														  _barrier_type		 barrier_type,
														  _verification_mean verification_mean)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!should_use_images)
	{
		/* Sanity check: no barrier should be requested if images are not used */
		DE_ASSERT(barrier_type == BARRIER_TYPE_NONE);

		/* Sanity check: glGetTexImage*() call should only be used for verification
		 *               when images are used */
		DE_ASSERT(verification_mean == VERIFICATION_MEAN_PROGRAM);
	}

	/* Determine GL id of an object we will be rendering the gradient to */
	glw::GLuint  write_to_id	 = 0;
	unsigned int write_to_width  = 0;
	unsigned int write_to_height = 0;

	getWritePropertiesForTextureType(texture_type, &write_to_id, &write_to_width, &write_to_height);

	/* Configure the render targets */
	if (should_use_images)
	{
		gl.bindImageTexture(0,				/* unit */
							write_to_id, 1, /* second level */
							GL_FALSE,		/* layered */
							0,				/* layer */
							GL_WRITE_ONLY, GL_RGBA8);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");
	}
	else
	{
		/* We first need to fill either the texture or its sibling view with
		 * gradient data. Set up draw framebuffer */
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_draw_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed for GL_FRAMEBUFFER target");

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, write_to_id, 1); /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Configure the viewport accordingly */
		gl.viewport(0, /* x */
					0, /* y */
					write_to_width, write_to_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");
	}

	/* The gradient needs to be rendered differently, depending on whether
	 * we're asked to use images or not */
	if (should_use_images)
	{
		gl.useProgram(m_gradient_image_write_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.uniform2i(m_gradient_image_write_image_size_location, write_to_width, write_to_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2i() call failed.");

		gl.enable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, write_to_width * write_to_height);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.disable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) call failed.");

		/* If the caller requested any barriers, issue them at this point */
		switch (barrier_type)
		{
		case BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT:
		{
			gl.memoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glMemoryBarrier() call failed for GL_TEXTURE_FETCH_BARRIER_BIT barrier");

			break;
		}

		case BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT:
		{
			gl.memoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glMemoryBarrier() call failed for GL_TEXTURE_UPDATE_BARRIER_BIT barrier");

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized barrier type");
		}
		} /* switch (barrier_type) */
	}	 /* if (should_use_images) */
	else
	{
		/* Render the gradient on a full-screen quad */
		gl.useProgram(m_gradient_write_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gluseProgram() call failed.");

		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}

	/* Determine which texture and which mip-map level we will need to sample
	 * in order to verify whether the former operations have been completed
	 * successfully.
	 **/
	unsigned int read_lod   = 0;
	glw::GLuint  read_to_id = 0;

	getReadPropertiesForTextureType(texture_type, &read_to_id, &read_lod);

	/* Before we proceed with verification, update the texture binding so that
	 * the verification program can sample from the right texture */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, read_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	if (verification_mean == VERIFICATION_MEAN_PROGRAM)
	{
		/* Switch to a verification program. It uses a vertex shader to sample
		 * all texels of the texture so issue as many invocations as necessary. */
		unsigned int n_invocations = write_to_width * write_to_height;

		gl.useProgram(m_gradient_verification_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.uniform1i(m_gradient_verification_po_texture_location, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

		gl.uniform1i(m_gradient_verification_po_sample_exact_uv_location, should_use_images);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

		gl.uniform1f(m_gradient_verification_po_lod_location, (float)read_lod);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");

		gl.enable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, n_invocations);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

		gl.disable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) call failed.");

		/* Map the result buffer object storage into process space */
		const int* result_data_ptr = (const int*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

		if (result_data_ptr == DE_NULL)
		{
			TCU_FAIL("glMapBuffer() did not generate an error but returned a NULL pointer");
		}

		/* Verify the XFBed data */
		for (unsigned int n_invocation = 0; n_invocation < n_invocations; ++n_invocation)
		{
			if (result_data_ptr[n_invocation] != 1)
			{
				unsigned int invocation_x = n_invocation % write_to_width;
				unsigned int invocation_y = n_invocation / write_to_width;

				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled at "
								   << "(" << invocation_x << ", " << invocation_y << ") when sampling from "
								   << ((texture_type == TEXTURE_TYPE_PARENT_TEXTURE) ? "a texture" : "a view")
								   << tcu::TestLog::EndMessage;

				/* Make sure the buffer is unmapped before throwing the exception */
				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

				TCU_FAIL("Invalid data sampled");
			}
		} /* for (all invocations) */

		/* Unmap the buffer storage */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
	} /* if (verification_mean == VERIFICATION_MEAN_PROGRAM) */
	else
	{
		DE_ASSERT(verification_mean == VERIFICATION_MEAN_GLGETTEXIMAGE);

		/* Allocate space for the data */
		unsigned char* data_ptr = new unsigned char[write_to_width * write_to_height * m_texture_n_components];

		/* Retrieve the rendered data */
		gl.getTexImage(GL_TEXTURE_2D, read_lod, GL_RGBA, GL_UNSIGNED_BYTE, data_ptr);

		if (gl.getError() != GL_NO_ERROR)
		{
			/* Release the buffer before we throw an exception */
			delete[] data_ptr;

			TCU_FAIL("glGetTexImage() call failed.");
		}

		/* Verify the data is correct */
		const int epsilon		  = 1;
		bool	  is_data_correct = true;

		for (unsigned int y = 0; y < write_to_height; ++y)
		{
			const unsigned char* row_ptr = data_ptr + y * m_texture_n_components * write_to_width;

			for (unsigned int x = 0; x < write_to_width; ++x)
			{
				const unsigned char* texel_ptr	= row_ptr + x * m_texture_n_components;
				const float			 end_rgba[]   = { 0.0f, 0.1f, 1.0f, 1.0f };
				const float			 lerp_factor  = float(x) / float(write_to_width);
				const float			 start_rgba[] = { 1.0f, 0.9f, 0.0f, 0.0f };
				const float expected_data_float[] = { start_rgba[0] * (1.0f - lerp_factor) + end_rgba[0] * lerp_factor,
													  start_rgba[1] * (1.0f - lerp_factor) + end_rgba[1] * lerp_factor,
													  start_rgba[2] * (1.0f - lerp_factor) + end_rgba[2] * lerp_factor,
													  start_rgba[3] * (1.0f - lerp_factor) +
														  end_rgba[3] * lerp_factor };
				const unsigned char expected_data_ubyte[] = { (unsigned char)(expected_data_float[0] * 255.0f),
															  (unsigned char)(expected_data_float[1] * 255.0f),
															  (unsigned char)(expected_data_float[2] * 255.0f),
															  (unsigned char)(expected_data_float[3] * 255.0f) };

				if (de::abs((int)texel_ptr[0] - (int)expected_data_ubyte[0]) > epsilon ||
					de::abs((int)texel_ptr[1] - (int)expected_data_ubyte[1]) > epsilon ||
					de::abs((int)texel_ptr[2] - (int)expected_data_ubyte[2]) > epsilon ||
					de::abs((int)texel_ptr[3] - (int)expected_data_ubyte[3]) > epsilon)
				{
					is_data_correct = false;

					break;
				}
			}
		} /* for (all rows) */

		/* Good to release the data buffer at this point */
		delete[] data_ptr;

		data_ptr = DE_NULL;

		/* Fail the test if any of the rendered texels were found invalid */
		if (!is_data_correct)
		{
			TCU_FAIL("Invalid data sampled");
		}
	}
}